

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::Texture2DFileCase::iterate(Texture2DFileCase *this)

{
  int preferredHeight;
  RenderContext *context;
  bool bVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  RGBA threshold;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *description;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  Surface renderedFrame;
  RandomViewport local_160;
  TestLog *local_150;
  _Vector_base<float,_std::allocator<float>_> local_148;
  Surface local_128;
  Surface local_110;
  SurfaceAccess local_f8;
  ReferenceParams local_d8;
  Texture2DView local_40;
  long lVar5;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  local_150 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = (this->m_texture->m_refTexture).m_width;
  preferredHeight = (this->m_texture->m_refTexture).m_height;
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_160,(RenderTarget *)CONCAT44(extraout_var_00,iVar3),iVar2,preferredHeight,dVar4)
  ;
  tcu::Surface::Surface(&local_110,local_160.width,local_160.height);
  tcu::Surface::Surface(&local_128,local_160.width,local_160.height);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  local_d8.super_RenderParams.texType =
       (TextureType)
       tcu::PixelFormat::getColorThreshold((PixelFormat *)(CONCAT44(extraout_var_01,iVar2) + 8));
  local_f8.m_surface = (Surface *)CONCAT44(local_f8.m_surface._4_4_,0x1010101);
  threshold = tcu::operator+((RGBA *)&local_d8,(RGBA *)&local_f8);
  local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super_RenderParams.texType = TEXTURETYPE_2D;
  local_d8.super_RenderParams.samplerType = SAMPLERTYPE_FLOAT;
  local_148._M_impl.super__Vector_impl_data._M_start = (float *)0x0;
  local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.m_surface = (Surface *)0x3f8000003f800000;
  glu::TextureTestUtil::computeQuadTexCoord2D
            ((vector<float,_std::allocator<float>_> *)&local_148,(Vec2 *)&local_d8,(Vec2 *)&local_f8
            );
  (**(code **)(lVar5 + 0x1a00))(local_160.x,local_160.y,local_160.width,local_160.height);
  (**(code **)(lVar5 + 8))(0x84c0);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,0x2600);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFormatTests.cpp"
                  ,0x44c);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,local_148._M_impl.super__Vector_impl_data._M_start,TEXTURETYPE_2D);
  context = this->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_d8,&local_110);
  glu::readPixels(context,local_160.x,local_160.y,(PixelBufferAccess *)&local_d8);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFormatTests.cpp"
                  ,0x451);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_d8,TEXTURETYPE_2D);
  local_d8.sampler.wrapS = CLAMP_TO_EDGE;
  local_d8.sampler.wrapT = CLAMP_TO_EDGE;
  local_d8.sampler.wrapR = CLAMP_TO_EDGE;
  local_d8.sampler.minFilter = NEAREST;
  local_d8.sampler.magFilter = NEAREST;
  local_d8.sampler.lodThreshold = 0.0;
  local_d8.sampler.normalizedCoords = true;
  local_d8.sampler.compare = COMPAREMODE_NONE;
  local_d8.sampler.compareChannel = 0;
  local_d8.sampler.borderColor.v._0_8_ = 0;
  local_d8.sampler.borderColor.v._8_8_ = 0;
  local_d8.sampler.seamlessCubeMap = false;
  local_d8.sampler._53_3_ = 0;
  local_d8.sampler.depthStencilMode = MODE_DEPTH;
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            (&local_f8,&local_128,(PixelFormat *)(CONCAT44(extraout_var_02,iVar2) + 8));
  local_40.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
  local_40.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
  glu::TextureTestUtil::sampleTexture
            (&local_f8,&local_40,local_148._M_impl.super__Vector_impl_data._M_start,&local_d8);
  bVar1 = glu::TextureTestUtil::compareImages(local_150,&local_128,&local_110,threshold);
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)!bVar1,description);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_148);
  tcu::Surface::~Surface(&local_128);
  tcu::Surface::~Surface(&local_110);
  return STOP;
}

Assistant:

Texture2DFileCase::IterateResult Texture2DFileCase::iterate (void)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), m_texture->getRefTexture().getWidth(), m_texture->getRefTexture().getHeight(), deStringHash(getName()));
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;

	computeQuadTexCoord2D(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Draw.
	m_renderer.renderQuad(0, &texCoord[0], TEXTURETYPE_2D);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels()");

	// Compute reference.
	ReferenceParams refParams(TEXTURETYPE_2D);
	refParams.sampler = Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], refParams);

	// Compare and log.
	bool isOk = compareImages(log, referenceFrame, renderedFrame, threshold);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}